

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_bang(t_slider *x)

{
  t_float f;
  double out;
  t_slider *x_local;
  
  if (pd_compatibilitylevel < 0x2e) {
    f = slider_getfval(x);
  }
  else {
    f = x->x_fval;
  }
  outlet_float((x->x_gui).x_obj.te_outlet,f);
  if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0)) {
    pd_float(((x->x_gui).x_snd)->s_thing,f);
  }
  return;
}

Assistant:

static void slider_bang(t_slider *x)
{
    double out;

    if (pd_compatibilitylevel < 46)
        out = slider_getfval(x);
    else out = x->x_fval;
    outlet_float(x->x_gui.x_obj.ob_outlet, out);
    if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
        pd_float(x->x_gui.x_snd->s_thing, out);
}